

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O3

vector<Quaternion,_std::allocator<Quaternion>_> *
load_quaternion_cloud
          (vector<Quaternion,_std::allocator<Quaternion>_> *__return_storage_ptr__,string *filename)

{
  iterator __position;
  pointer pQVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  Quaternion q;
  ifstream stream;
  Quaternion local_248;
  double local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(local_228,(string *)filename,_S_in);
  (__return_storage_ptr__->super__Vector_base<Quaternion,_std::allocator<Quaternion>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Quaternion,_std::allocator<Quaternion>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Quaternion,_std::allocator<Quaternion>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((abStack_208[*(long *)((long)local_228[0] + -0x18)] & 2) == 0) {
    lVar3 = 0;
    do {
      do {
        std::istream::_M_extract<double>(local_228);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<Quaternion,_std::allocator<Quaternion>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<Quaternion,_std::allocator<Quaternion>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Quaternion,std::allocator<Quaternion>>::_M_realloc_insert<Quaternion_const&>
                  ((vector<Quaternion,std::allocator<Quaternion>> *)__return_storage_ptr__,
                   __position,&local_248);
      }
      else {
        (__position._M_current)->p[2] = local_248.p[2];
        (__position._M_current)->p[3] = local_248.p[3];
        (__position._M_current)->p[0] = local_248.p[0];
        (__position._M_current)->p[1] = local_248.p[1];
        (__return_storage_ptr__->super__Vector_base<Quaternion,_std::allocator<Quaternion>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar3 = 0;
    } while ((abStack_208[*(long *)((long)local_228[0] + -0x18)] & 2) == 0);
    pQVar1 = (__return_storage_ptr__->super__Vector_base<Quaternion,_std::allocator<Quaternion>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    pQVar1 = (pointer)0x0;
  }
  (__return_storage_ptr__->super__Vector_base<Quaternion,_std::allocator<Quaternion>_>)._M_impl.
  super__Vector_impl_data._M_finish = pQVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loaded ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," points!",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

vector<Quaternion> load_quaternion_cloud(const string filename)
{
    ifstream stream(filename); 
    vector<Quaternion> cloud;
    Quaternion q;
    int lines_loaded = 0;
    while (!stream.eof()) {
        for (int i = 0; i < 4; i++) stream >> q.p[i];
        cloud.push_back(q);
        lines_loaded += 1;
    }
    cloud.pop_back();
    cout << "Loaded " << cloud.size() << " points!" << endl;
    return cloud;
}